

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

void __thiscall
burst::
subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
::subset_iterator(subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                  *this,int *first,int *last)

{
  bool bVar1;
  allocator_type local_11;
  
  this->m_begin = first;
  this->m_end = last;
  std::vector<const_int_*,_std::allocator<const_int_*>_>::vector
            (&this->m_subset,(long)last - (long)first >> 2,&local_11);
  this->m_subset_size = 0;
  bVar1 = std::is_sorted<int_const*,std::greater<void>>(this->m_begin,this->m_end);
  if (bVar1) {
    increment(this);
    return;
  }
  __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                ,0x5d,
                "burst::subset_iterator<const int *, std::greater<void>>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = const int *, Compare = std::greater<void>, SubsetContainer = std::vector<const int *>]"
               );
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }